

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O1

void Vec_StrPrintNum(Vec_Str_t *p,int Num)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  char Digits [16];
  char local_38 [24];
  
  if (Num == 0) {
    uVar4 = p->nCap;
    if (p->nSize == uVar4) {
      if ((int)uVar4 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(0x10);
        }
        else {
          pcVar3 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar3;
        sVar6 = 0x10;
      }
      else {
        sVar6 = (ulong)uVar4 * 2;
        if ((int)sVar6 <= (int)uVar4) goto LAB_008698a3;
        if (p->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(sVar6);
        }
        else {
          pcVar3 = (char *)realloc(p->pArray,sVar6);
        }
        p->pArray = pcVar3;
      }
      p->nCap = (int)sVar6;
    }
LAB_008698a3:
    iVar2 = p->nSize;
    p->nSize = iVar2 + 1;
    p->pArray[iVar2] = '0';
    return;
  }
  uVar5 = (ulong)(uint)Num;
  if (-1 < Num) goto LAB_008698dd;
  uVar4 = p->nCap;
  if (p->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(p->pArray,0x10);
      }
      p->pArray = pcVar3;
      sVar6 = 0x10;
    }
    else {
      sVar6 = (ulong)uVar4 * 2;
      if ((int)sVar6 <= (int)uVar4) goto LAB_008698c9;
      if (p->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar6);
      }
      else {
        pcVar3 = (char *)realloc(p->pArray,sVar6);
      }
      p->pArray = pcVar3;
    }
    p->nCap = (int)sVar6;
  }
LAB_008698c9:
  iVar2 = p->nSize;
  p->nSize = iVar2 + 1;
  p->pArray[iVar2] = '-';
  uVar5 = (ulong)(uint)-Num;
LAB_008698dd:
  uVar7 = 0xffffffffffffffff;
  do {
    uVar4 = (uint)uVar5;
    local_38[uVar7 + 1] = (char)uVar5 + (char)(uVar5 / 10) * -10;
    uVar7 = uVar7 + 1;
    uVar5 = uVar5 / 10;
  } while (9 < uVar4);
  do {
    cVar1 = local_38[uVar7 & 0xffffffff];
    uVar4 = p->nCap;
    if (p->nSize == uVar4) {
      if ((int)uVar4 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(0x10);
        }
        else {
          pcVar3 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar3;
        sVar6 = 0x10;
      }
      else {
        sVar6 = (ulong)uVar4 * 2;
        if ((int)sVar6 <= (int)uVar4) goto LAB_0086997a;
        if (p->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(sVar6);
        }
        else {
          pcVar3 = (char *)realloc(p->pArray,sVar6);
        }
        p->pArray = pcVar3;
      }
      p->nCap = (int)sVar6;
    }
LAB_0086997a:
    iVar2 = p->nSize;
    p->nSize = iVar2 + 1;
    p->pArray[iVar2] = cVar1 + '0';
    uVar7 = uVar7 - 1;
    if ((int)uVar7 + 2 < 2) {
      return;
    }
  } while( true );
}

Assistant:

static inline void Vec_StrPrintNum( Vec_Str_t * p, int Num )
{
    int i;
    char Digits[16];
    if ( Num == 0 )
    {
        Vec_StrPush( p, '0' );
        return;
    }
    if ( Num < 0 )
    {
        Vec_StrPush( p, '-' );
        Num = -Num;
    }
    for ( i = 0; Num; Num /= 10,  i++ )
        Digits[i] = Num % 10;
    for ( i--; i >= 0; i-- )
        Vec_StrPush( p, (char)('0' + Digits[i]) );
}